

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O1

void close_sockets(pmtr_t *cfg)

{
  int *piVar1;
  long lVar2;
  UT_array *pUVar3;
  int *piVar4;
  ulong uVar5;
  
  piVar4 = (int *)0x0;
  do {
    if (piVar4 == (int *)0x0) {
      if (cfg->listen->i == 0) goto LAB_00107563;
      piVar4 = (int *)cfg->listen->d;
    }
    else {
      pUVar3 = cfg->listen;
      piVar1 = (int *)pUVar3->d;
      if (piVar4 < piVar1) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)((long)piVar4 - (long)piVar1) / (pUVar3->icd).sz + 1;
      }
      if (uVar5 < pUVar3->i) {
        uVar5 = (pUVar3->icd).sz;
        if (piVar4 < piVar1) {
          lVar2 = 0;
        }
        else {
          lVar2 = (ulong)((long)piVar4 - (long)piVar1) / uVar5 + 1;
        }
        piVar4 = (int *)((long)piVar1 + lVar2 * uVar5);
      }
      else {
LAB_00107563:
        piVar4 = (int *)0x0;
      }
    }
    if (piVar4 == (int *)0x0) break;
    close(*piVar4);
  } while( true );
  piVar4 = (int *)0x0;
  do {
    if (piVar4 == (int *)0x0) {
      if (cfg->report->i == 0) goto LAB_001075d4;
      piVar4 = (int *)cfg->report->d;
    }
    else {
      pUVar3 = cfg->report;
      piVar1 = (int *)pUVar3->d;
      if (piVar4 < piVar1) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)((long)piVar4 - (long)piVar1) / (pUVar3->icd).sz + 1;
      }
      if (uVar5 < pUVar3->i) {
        uVar5 = (pUVar3->icd).sz;
        if (piVar4 < piVar1) {
          lVar2 = 0;
        }
        else {
          lVar2 = (ulong)((long)piVar4 - (long)piVar1) / uVar5 + 1;
        }
        piVar4 = (int *)((long)piVar1 + lVar2 * uVar5);
      }
      else {
LAB_001075d4:
        piVar4 = (int *)0x0;
      }
    }
    if (piVar4 == (int *)0x0) {
      if (cfg->listen->i != 0) {
        if (((cfg->listen->icd).dtor != (undefined1 *)0x0) && (pUVar3 = cfg->listen, pUVar3->i != 0)
           ) {
          uVar5 = 0;
          do {
            (*(code *)(pUVar3->icd).dtor)(pUVar3->d + (pUVar3->icd).sz * uVar5);
            uVar5 = uVar5 + 1;
            pUVar3 = cfg->listen;
          } while (uVar5 < pUVar3->i);
        }
        cfg->listen->i = 0;
      }
      if (cfg->report->i != 0) {
        if (((cfg->report->icd).dtor != (undefined1 *)0x0) && (pUVar3 = cfg->report, pUVar3->i != 0)
           ) {
          uVar5 = 0;
          do {
            (*(code *)(pUVar3->icd).dtor)(pUVar3->d + (pUVar3->icd).sz * uVar5);
            uVar5 = uVar5 + 1;
            pUVar3 = cfg->report;
          } while (uVar5 < pUVar3->i);
        }
        cfg->report->i = 0;
      }
      return;
    }
    close(*piVar4);
  } while( true );
}

Assistant:

void close_sockets(pmtr_t *cfg) {
  int *fd;
  fd=NULL; while( (fd=(int*)utarray_next(cfg->listen,fd))) close(*fd);
  fd=NULL; while( (fd=(int*)utarray_next(cfg->report,fd))) close(*fd);
  utarray_clear(cfg->listen);
  utarray_clear(cfg->report);
}